

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

pair<double,_unsigned_long> units::getPrefixMultiplierWord(string *unit)

{
  int iVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar4;
  size_t __n;
  undefined1 *puVar5;
  char *pcVar6;
  pair<double,_unsigned_long> pVar7;
  ulong uVar3;
  
  puVar5 = prefixWords;
  uVar3 = 0x24;
  do {
    uVar2 = uVar3 >> 1;
    iVar1 = strncmp(*(char **)((long)((array<std::pair<const_char_*,_const_char_*>,_12UL> *)puVar5)
                                     ->_M_elems + uVar2 * 0x18 + 0x10),(char *)unit,
                    (long)*(int *)((long)((array<std::pair<const_char_*,_const_char_*>,_12UL> *)
                                         puVar5)->_M_elems + uVar2 * 0x18));
    uVar4 = uVar2;
    if (iVar1 < 0) {
      uVar4 = ~uVar2 + uVar3;
      puVar5 = (undefined1 *)
               ((long)((array<std::pair<const_char_*,_const_char_*>,_12UL> *)puVar5)->_M_elems +
               uVar2 * 0x18 + 0x18);
    }
    uVar3 = uVar4;
  } while (0 < (long)uVar4);
  pcVar6 = (char *)0x0;
  if ((array<std::pair<const_char_*,_const_char_*>,_12UL> *)puVar5 ==
      &modifyTailCodes::trailTempCodeReplacements) {
    __n = 0;
  }
  else {
    __n = (size_t)*(int *)&((array<std::pair<const_char_*,_const_char_*>,_12UL> *)puVar5)->_M_elems
                           [0].first;
    iVar1 = strncmp(((array<std::pair<const_char_*,_const_char_*>,_12UL> *)puVar5)->_M_elems[1].
                    first,(char *)unit,__n);
    if (iVar1 == 0) {
      pcVar6 = ((array<std::pair<const_char_*,_const_char_*>,_12UL> *)puVar5)->_M_elems[0].second;
    }
    else {
      __n = 0;
      pcVar6 = (char *)0x0;
    }
  }
  pVar7.second = __n;
  pVar7.first = (double)pcVar6;
  return pVar7;
}

Assistant:

static std::pair<double, size_t>
    getPrefixMultiplierWord(const std::string& unit)
{
    // NOLINTNEXTLINE (readability-qualified-auto)
    auto res = std::lower_bound(
        prefixWords.begin(),
        prefixWords.end(),
        unit.c_str(),
        [](const utup& prefix, const char* val) {
            return (strncmp(std::get<0>(prefix), val, std::get<2>(prefix)) < 0);
        });
    if (res != prefixWords.end()) {
        if (strncmp(std::get<0>(*res), unit.c_str(), std::get<2>(*res)) == 0) {
            return {std::get<1>(*res), std::get<2>(*res)};
        }
    }
    return {0.0, 0};
}